

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void __thiscall Fossilize::ScratchAllocator::reset(ScratchAllocator *this)

{
  Impl *this_00;
  size_type sVar1;
  reference pvVar2;
  __normal_iterator<Fossilize::ScratchAllocator::Impl::Block_*,_std::vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>_>
  local_40;
  const_iterator local_38;
  __normal_iterator<Fossilize::ScratchAllocator::Impl::Block_*,_std::vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>_>
  local_30;
  __normal_iterator<Fossilize::ScratchAllocator::Impl::Block_*,_std::vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>_>
  local_28;
  const_iterator local_20;
  size_t local_18;
  size_t peak;
  ScratchAllocator *this_local;
  
  peak = (size_t)this;
  local_18 = get_peak_memory_consumption(this);
  if (this->impl->peak_history_size < local_18) {
    this->impl->peak_history_size = local_18;
  }
  sVar1 = std::
          vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
          ::size(&this->impl->blocks);
  if (sVar1 != 0) {
    sVar1 = std::
            vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
            ::size(&this->impl->blocks);
    if (1 < sVar1) {
      this_00 = this->impl;
      local_30._M_current =
           (Block *)std::
                    vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                    ::begin(&this->impl->blocks);
      local_28 = __gnu_cxx::
                 __normal_iterator<Fossilize::ScratchAllocator::Impl::Block_*,_std::vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>_>
                 ::operator+(&local_30,1);
      __gnu_cxx::
      __normal_iterator<Fossilize::ScratchAllocator::Impl::Block_const*,std::vector<Fossilize::ScratchAllocator::Impl::Block,std::allocator<Fossilize::ScratchAllocator::Impl::Block>>>
      ::__normal_iterator<Fossilize::ScratchAllocator::Impl::Block*>
                ((__normal_iterator<Fossilize::ScratchAllocator::Impl::Block_const*,std::vector<Fossilize::ScratchAllocator::Impl::Block,std::allocator<Fossilize::ScratchAllocator::Impl::Block>>>
                  *)&local_20,&local_28);
      local_40._M_current =
           (Block *)std::
                    vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                    ::end(&this->impl->blocks);
      __gnu_cxx::
      __normal_iterator<Fossilize::ScratchAllocator::Impl::Block_const*,std::vector<Fossilize::ScratchAllocator::Impl::Block,std::allocator<Fossilize::ScratchAllocator::Impl::Block>>>
      ::__normal_iterator<Fossilize::ScratchAllocator::Impl::Block*>
                ((__normal_iterator<Fossilize::ScratchAllocator::Impl::Block_const*,std::vector<Fossilize::ScratchAllocator::Impl::Block,std::allocator<Fossilize::ScratchAllocator::Impl::Block>>>
                  *)&local_38,&local_40);
      std::
      vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
      ::erase(&this_00->blocks,local_20,local_38);
    }
    pvVar2 = std::
             vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
             ::operator[](&this->impl->blocks,0);
    pvVar2->offset = 0;
  }
  return;
}

Assistant:

void ScratchAllocator::reset()
{
	// Keep track of how large the buffer can grow.
	size_t peak = get_peak_memory_consumption();
	if (peak > impl->peak_history_size)
		impl->peak_history_size = peak;

	if (impl->blocks.size() > 0)
	{
		// free all but first block
		if (impl->blocks.size() > 1)
			impl->blocks.erase(impl->blocks.begin() + 1, impl->blocks.end());
		// reset offset on first block
		impl->blocks[0].offset = 0;
	}
}